

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::get_struct_type
          (Impl *this,Vector<spv::Id> *type_ids,TypeLayoutFlags flags,char *name)

{
  anon_class_24_3_af55428c_for__M_pred __pred;
  initializer_list<unsigned_int> __l;
  Id IVar1;
  Vector<spv::Id> *type_ids_00;
  Vector<Id> *members;
  bool bVar2;
  uint flags_00;
  iterator __first;
  iterator __last;
  char *pcVar3;
  Builder *pBVar4;
  pointer pSVar5;
  StructTypeEntry *local_100;
  allocator_type local_e5;
  Id id;
  iterator local_e0;
  undefined8 local_d8;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_d0;
  Id local_b8;
  undefined4 local_b4;
  Id struct_type_id;
  TypeLayoutFlags block_flags;
  StructTypeEntry entry;
  __normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
  local_38;
  __normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
  itr;
  char *name_local;
  Vector<spv::Id> *pVStack_20;
  TypeLayoutFlags flags_local;
  Vector<spv::Id> *type_ids_local;
  Impl *this_local;
  
  itr._M_current = (StructTypeEntry *)name;
  name_local._4_4_ = flags;
  pVStack_20 = type_ids;
  type_ids_local = (Vector<spv::Id> *)this;
  __first = std::
            vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
            ::begin(&this->cached_struct_types);
  __last = std::
           vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
           ::end(&this->cached_struct_types);
  __pred.flags = (TypeLayoutFlags *)((long)&name_local + 4);
  __pred.type_ids = pVStack_20;
  __pred.name = (char **)&itr;
  local_38 = std::
             find_if<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry*,std::vector<dxil_spv::Converter::Impl::StructTypeEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>>>,dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                       (__first._M_current,__last._M_current,__pred);
  entry._64_8_ = std::
                 vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
                 ::end(&this->cached_struct_types);
  bVar2 = __gnu_cxx::operator==
                    (&local_38,
                     (__normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
                      *)&entry.flags);
  if (bVar2) {
    StructTypeEntry::StructTypeEntry((StructTypeEntry *)&struct_type_id);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               ((long)&entry.name.field_2 + 8),pVStack_20);
    if (itr._M_current == (StructTypeEntry *)0x0) {
      local_100 = (StructTypeEntry *)0x2a395b;
    }
    else {
      local_100 = itr._M_current;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&entry,(char *)local_100);
    type_ids_00 = pVStack_20;
    if ((name_local._4_4_ & 8) == 0) {
      pBVar4 = builder(this);
      members = pVStack_20;
      pcVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)&entry);
      struct_type_id = spv::Builder::makeStructType(pBVar4,members,pcVar3);
      if ((name_local._4_4_ & 1) != 0) {
        decorate_physical_offsets(this,struct_type_id,pVStack_20);
      }
    }
    else {
      local_b4 = 0xe;
      flags_00 = name_local._4_4_ & 0xfffffff1;
      pcVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)&entry);
      local_b8 = get_struct_type(this,type_ids_00,flags_00,pcVar3);
      pBVar4 = builder(this);
      id = local_b8;
      local_e0 = &id;
      local_d8 = 1;
      __l._M_len = 1;
      __l._M_array = local_e0;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                (&local_d0,__l,&local_e5);
      pcVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)&entry);
      struct_type_id = spv::Builder::makeStructType(pBVar4,&local_d0,pcVar3);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_d0);
      pBVar4 = builder(this);
      spv::Builder::addDecoration(pBVar4,struct_type_id,DecorationBlock,-1);
      pBVar4 = builder(this);
      spv::Builder::addMemberDecoration(pBVar4,struct_type_id,0,DecorationOffset,0);
      if ((name_local._4_4_ & 4) != 0) {
        pBVar4 = builder(this);
        spv::Builder::addMemberDecoration(pBVar4,struct_type_id,0,DecorationCoherent,-1);
      }
      if ((name_local._4_4_ & 2) != 0) {
        pBVar4 = builder(this);
        spv::Builder::addMemberDecoration(pBVar4,struct_type_id,0,DecorationNonWritable,-1);
      }
      pBVar4 = builder(this);
      spv::Builder::addMemberName(pBVar4,struct_type_id,0,"data");
    }
    IVar1 = struct_type_id;
    entry.subtypes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = name_local._4_4_;
    std::
    vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
    ::push_back(&this->cached_struct_types,(value_type *)&struct_type_id);
    this_local._4_4_ = IVar1;
    StructTypeEntry::~StructTypeEntry((StructTypeEntry *)&struct_type_id);
  }
  else {
    pSVar5 = __gnu_cxx::
             __normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
             ::operator->(&local_38);
    this_local._4_4_ = pSVar5->id;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id Converter::Impl::get_struct_type(const Vector<spv::Id> &type_ids, TypeLayoutFlags flags, const char *name)
{
	auto itr = std::find_if(cached_struct_types.begin(), cached_struct_types.end(), [&](const StructTypeEntry &entry) -> bool {
		if (type_ids.size() != entry.subtypes.size())
			return false;
		if (flags != entry.flags)
			return false;
		if ((!name && !entry.name.empty()) || (entry.name != name))
			return false;

		for (unsigned i = 0; i < type_ids.size(); i++)
			if (type_ids[i] != entry.subtypes[i])
				return false;

		return true;
	});

	if (itr == cached_struct_types.end())
	{
		StructTypeEntry entry;
		entry.subtypes = type_ids;
		entry.name = name ? name : "";

		if ((flags & TYPE_LAYOUT_BLOCK_BIT) != 0)
		{
			constexpr TypeLayoutFlags block_flags = TYPE_LAYOUT_BLOCK_BIT |
			                                        TYPE_LAYOUT_COHERENT_BIT |
			                                        TYPE_LAYOUT_READ_ONLY_BIT;
			spv::Id struct_type_id = get_struct_type(type_ids, flags & ~block_flags, entry.name.c_str());
			entry.id = builder().makeStructType({ struct_type_id }, entry.name.c_str());
			builder().addDecoration(entry.id, spv::DecorationBlock);
			builder().addMemberDecoration(entry.id, 0, spv::DecorationOffset, 0);
			if ((flags & TYPE_LAYOUT_COHERENT_BIT) != 0)
				builder().addMemberDecoration(entry.id, 0, spv::DecorationCoherent);
			if ((flags & TYPE_LAYOUT_READ_ONLY_BIT) != 0)
				builder().addMemberDecoration(entry.id, 0, spv::DecorationNonWritable);
			builder().addMemberName(entry.id, 0, "data");
		}
		else
		{
			entry.id = builder().makeStructType(type_ids, entry.name.c_str());
			if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) != 0)
				decorate_physical_offsets(entry.id, type_ids);
		}

		entry.flags = flags;
		spv::Id id = entry.id;
		cached_struct_types.push_back(std::move(entry));
		return id;
	}
	else
		return itr->id;
}